

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

int __thiscall GrcSymbolTableEntry::UserDefinableSlotAttrIndex(GrcSymbolTableEntry *this)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RDI;
  char ch;
  size_t ich;
  int nRet;
  ulong local_20;
  int local_14;
  
  local_14 = 0;
  local_20 = 4;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= local_20) {
      return local_14 + -1;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar3;
    if (cVar1 < '0') break;
    if ('9' < cVar1) {
      return -1;
    }
    local_14 = local_14 * 10 + cVar1 + -0x30;
    local_20 = local_20 + 1;
  }
  return -1;
}

Assistant:

int GrcSymbolTableEntry::UserDefinableSlotAttrIndex()
{
	Assert(IsUserDefinableSlotAttr());
	int nRet = 0;
	for (size_t ich = 4; ich < m_staFieldName.length(); ich++)
	{
		char ch = m_staFieldName[ich];
		if (ch < '0')
			return -1;
		if (ch > '9')
			return -1;
		nRet = (nRet * 10) + (ch - '0');
	}
	return nRet - 1;	// 0-based
}